

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContext.h
# Opt level: O0

void __thiscall Diligent::Viewport::Viewport(Viewport *this)

{
  Viewport *this_local;
  
  this->TopLeftX = 0.0;
  this->TopLeftY = 0.0;
  this->Width = 0.0;
  this->Height = 0.0;
  this->MinDepth = 0.0;
  this->MaxDepth = 1.0;
  return;
}

Assistant:

constexpr Viewport() noexcept {}